

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O3

UINT8 __thiscall PlayerA::UnloadFile(PlayerA *this)

{
  int iVar1;
  
  if (this->_player != (PlayerBase *)0x0) {
    (*this->_player->_vptr_PlayerBase[0x20])();
    iVar1 = (*this->_player->_vptr_PlayerBase[6])();
    this->_player = (PlayerBase *)0x0;
    this->_dLoad = (DATA_LOADER *)0x0;
    return (UINT8)iVar1;
  }
  return 0xff;
}

Assistant:

UINT8 PlayerA::UnloadFile(void)
{
	if (_player == NULL)
		return 0xFF;
	
	_player->Stop();
	UINT8 retVal = _player->UnloadFile();
	_player = NULL;
	_dLoad = NULL;
	return retVal;
}